

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 207_courseSchedule.cpp
# Opt level: O1

bool canFinish(int numCourses,
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *prereq)

{
  vector<int,std::allocator<int>> *this;
  pointer pvVar1;
  iterator __position;
  int *piVar2;
  undefined8 uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  pointer piVar8;
  ostream *poVar9;
  pointer piVar10;
  vector<int,_std::allocator<int>_> *adj;
  ulong uVar11;
  int *piVar12;
  bool bVar13;
  pointer __x;
  int iVar14;
  long lVar15;
  long alStack_a0 [3];
  undefined1 auStack_88 [8];
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> vis;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> s;
  allocator_type local_35;
  int local_34;
  
  local_60._0_4_ = 0;
  alStack_a0[2] = 0x1024b7;
  local_34 = numCourses;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)numCourses,(value_type *)local_60,
             &local_35);
  vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)auStack_88;
  piVar8 = (pointer)(ulong)(uint)numCourses;
  lVar6 = -((long)piVar8 * 0x18 + 0xfU & 0xfffffffffffffff0);
  adj = (vector<int,_std::allocator<int>_> *)(auStack_88 + lVar6);
  if (numCourses != 0) {
    *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x10250f;
    memset(adj,0,(((long)piVar8 * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  __x = (prereq->
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (prereq->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    do {
      *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x10252a;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_60,__x);
      this = (vector<int,std::allocator<int>> *)
             (adj + *(int *)CONCAT44(local_60._4_4_,local_60._0_4_));
      piVar12 = (int *)CONCAT44(local_60._4_4_,local_60._0_4_) + 1;
      __position._M_current = *(int **)(this + 8);
      if (__position._M_current == *(int **)(this + 0x10)) {
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x10255a;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this,__position,piVar12)
        ;
      }
      else {
        *__position._M_current = *piVar12;
        *(int **)(this + 8) = __position._M_current + 1;
      }
      pvVar4 = (void *)CONCAT44(local_60._4_4_,local_60._0_4_);
      if (pvVar4 != (void *)0x0) {
        uVar11 = (long)s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pvVar4;
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x10256f;
        operator_delete(pvVar4,uVar11);
      }
      __x = __x + 1;
    } while (__x != pvVar1);
  }
  if (0 < local_34) {
    piVar10 = (pointer)0x0;
    do {
      s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piVar10;
      piVar2 = *(int **)(local_80 + (long)piVar10 * 0x18 + lVar6);
      for (piVar12 = adj[(long)piVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar12 != piVar2; piVar12 = piVar12 + 1) {
        iVar14 = *piVar12;
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x1025b6;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"index : ",8);
        piVar10 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage;
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x1025c6;
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)piVar10);
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x1025dd;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x1025e8;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar14);
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x1025fc;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      }
      uVar3 = *(undefined8 *)(std::cout + -0x18);
      *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x10261d;
      std::ios::widen((char)uVar3 + 'p');
      *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x10262c;
      std::ostream::put('p');
      *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x102634;
      std::ostream::flush();
      piVar10 = (pointer)((long)s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
    } while (piVar10 != piVar8);
  }
  bVar13 = local_34 < 1;
  if (0 < local_34) {
    iVar14 = 0;
    do {
      *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x102664;
      bVar7 = cycle(adj,(vector<int,_std::allocator<int>_> *)local_80,iVar14);
      if (bVar7) break;
      iVar14 = iVar14 + 1;
      bVar13 = local_34 <= iVar14;
    } while (iVar14 != local_34);
  }
  if (local_34 != 0) {
    lVar15 = (long)piVar8 * 0x18;
    do {
      pvVar4 = *(void **)((long)alStack_a0 + lVar15 + lVar6);
      if (pvVar4 != (void *)0x0) {
        lVar5 = *(long *)(auStack_88 + lVar15 + lVar6 + -8);
        *(undefined8 *)(auStack_88 + lVar6 + -8) = 0x1026a2;
        operator_delete(pvVar4,lVar5 - (long)pvVar4);
      }
      lVar15 = lVar15 + -0x18;
    } while (lVar15 != 0);
  }
  if (local_80 != (undefined1  [8])0x0) {
    piVar8 = vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar8[-2] = 0x1026c1;
    piVar8[-1] = 0;
    operator_delete((void *)local_80,
                    (long)vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_80);
  }
  return bVar13;
}

Assistant:

bool canFinish(int numCourses, vector<vector<int>>& prereq) {
    int n=numCourses;
    vector<int> vis(n,0);
    vector<int> adj[n];
    for (auto s : prereq)
    {
        adj[s[0]].push_back(s[1]);
    }
    for (int i=0;i<n;i++)
    {
    	for (auto s: adj[i])
    		cout<<"index : "<<i<<":"<<s<<" ";
    	cout<<endl;
    }
    for (int i=0;i<n;i++)
    {
        if (cycle(adj,vis,i))
            return false;
    }
    return true;
}